

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::structure::~structure(structure *this)

{
  byte *in_RDI;
  any *in_stack_000000c0;
  var *in_stack_000000c8;
  string *in_stack_ffffffffffffff48;
  domain_type *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff68;
  byte local_71;
  allocator local_59;
  string *in_stack_ffffffffffffffa8;
  domain_type *in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [40];
  
  local_71 = 0;
  if ((*in_RDI & 1) == 0) {
    std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x207657);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"finalize",&local_29);
    local_71 = domain_type::exist(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  if ((local_71 & 1) != 0) {
    std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x207704);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,"finalize",&local_59);
    domain_type::get_var(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    cs_impl::any::make<cs::structure,cs::structure*>
              ((structure **)CONCAT17(local_71,in_stack_ffffffffffffff68));
    invoke<cs_impl::any>(in_stack_000000c8,in_stack_000000c0);
    cs_impl::any::~any((any *)0x207787);
    cs_impl::any::~any((any *)0x207791);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  std::shared_ptr<cs::domain_type>::~shared_ptr((shared_ptr<cs::domain_type> *)0x2077b3);
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

~structure()
		{
			if (!m_shadow && m_data->exist("finalize"))
				invoke(m_data->get_var("finalize"), var::make<structure>(this));
		}